

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_interactor.cpp
# Opt level: O0

void Am_Animation_Stop_Method_proc
               (Am_Object *inter,Am_Object *object,Am_Object *event_window,Am_Input_Event *ev)

{
  int x;
  int y;
  Am_Value *pAVar1;
  undefined1 local_88 [8];
  Am_Inter_Internal_Method inter_method;
  Am_Object local_70;
  Am_Input_Char local_64;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50 [3];
  Am_Object local_38;
  Am_Object text;
  Am_Object command_obj;
  Am_Input_Event *ev_local;
  Am_Object *event_window_local;
  Am_Object *object_local;
  Am_Object *inter_local;
  
  Am_Object::Am_Object(&text);
  Am_Object::Am_Object(&local_38);
  pAVar1 = Am_Object::Get(inter,0xc5,0);
  Am_Object::operator=(&text,pAVar1);
  pAVar1 = Am_Object::Get(inter,0x11a,0);
  Am_Object::operator=(&local_38,pAVar1);
  Am_Object::Am_Object(local_50,inter);
  Am_Object::Am_Object(&local_58,&text);
  x = ev->x;
  y = ev->y;
  Am_Object::Am_Object(&local_60,event_window);
  local_64 = ev->input_char;
  Am_Object::Am_Object(&local_70,&local_38);
  Am_Inter_Location::Am_Inter_Location((Am_Inter_Location *)&inter_method.Call,&Am_No_Location);
  Am_Call_Final_Do_And_Register
            (local_50,&local_58,x,y,&local_60,local_64,&local_70,
             (Am_Inter_Location *)&inter_method.Call,(Am_Impl_Command_Setter *)0x0);
  Am_Inter_Location::~Am_Inter_Location((Am_Inter_Location *)&inter_method.Call);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(local_50);
  Am_Inter_Internal_Method::Am_Inter_Internal_Method((Am_Inter_Internal_Method *)local_88);
  pAVar1 = Am_Object::Get(&Am_Interactor,0xc2,0);
  Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)local_88,pAVar1);
  (*(code *)inter_method.from_wrapper)(inter,object,event_window,ev);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&text);
  return;
}

Assistant:

Am_Define_Method(Am_Inter_Internal_Method, void, Am_Animation_Stop_Method,
                 (Am_Object & inter, Am_Object &object, Am_Object &event_window,
                  Am_Input_Event *ev))
{
  Am_INTER_TRACE_PRINT(inter, "Animation stopping " << object);

  Am_Object command_obj, text;
  command_obj = inter.Get(Am_COMMAND);
  text = inter.Get(Am_START_OBJECT);
  // now call stop
  Am_Call_Final_Do_And_Register(inter, command_obj, ev->x, ev->y, event_window,
                                ev->input_char, text, Am_No_Location,
                                nullptr); //no impl_setter since no undo

  // LAST, call the prototype's method
  Am_Inter_Internal_Method inter_method;
  inter_method = Am_Interactor.Get(Am_INTER_STOP_METHOD);
  inter_method.Call(inter, object, event_window, ev);
}